

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WatcherGeneric.cpp
# Opt level: O1

void __thiscall
efsw::WatcherGeneric::WatcherGeneric
          (WatcherGeneric *this,WatchID id,string *directory,FileWatchListener *fwl,
          FileWatcherImpl *fw,bool recursive)

{
  pointer pcVar1;
  DirWatcherGeneric *this_00;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (directory->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + directory->_M_string_length);
  Watcher::Watcher(&this->super_Watcher,id,&local_50,fwl,recursive);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Watcher)._vptr_Watcher = (_func_int **)&PTR__WatcherGeneric_0012ebf8;
  this->WatcherImpl = fw;
  this->DirWatch = (DirWatcherGeneric *)0x0;
  FileSystem::dirAddSlashAtEnd(&(this->super_Watcher).Directory);
  this_00 = (DirWatcherGeneric *)operator_new(0xc0);
  DirWatcherGeneric::DirWatcherGeneric
            (this_00,(DirWatcherGeneric *)0x0,this,directory,recursive,false);
  this->DirWatch = this_00;
  DirWatcherGeneric::addChilds(this_00,false);
  return;
}

Assistant:

WatcherGeneric::WatcherGeneric( WatchID id, const std::string& directory, FileWatchListener* fwl,
								FileWatcherImpl* fw, bool recursive ) :
	Watcher( id, directory, fwl, recursive ), WatcherImpl( fw ), DirWatch( NULL ) {
	FileSystem::dirAddSlashAtEnd( Directory );

	DirWatch = new DirWatcherGeneric( NULL, this, directory, recursive, false );

	DirWatch->addChilds( false );
}